

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::checkAttDerivationOK
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *childTypeInfo)

{
  XMLCh XVar1;
  XMLCh XVar2;
  DefAttTypes DVar3;
  uint uVar4;
  SchemaAttDef *wildCard;
  XMLCh *text1;
  DatatypeValidator *pDVar5;
  bool bVar6;
  int iVar7;
  TraverseSchema *pTVar8;
  long lVar9;
  long lVar10;
  SchemaAttDef *pSVar11;
  ulong uVar12;
  XMLCh *pXVar13;
  XMLCh *pXVar14;
  TraverseSchema *this_00;
  ulong uVar15;
  
  pTVar8 = (TraverseSchema *)ComplexTypeInfo::getAttDefList(childTypeInfo);
  wildCard = baseTypeInfo->fAttWildCard;
  this_00 = pTVar8;
  lVar9 = (**(code **)(*(long *)pTVar8 + 0x50))();
  if (lVar9 != 0) {
    uVar15 = 0;
    do {
      lVar10 = (**(code **)(*(long *)pTVar8 + 0x58))(pTVar8,uVar15);
      lVar9 = *(long *)(lVar10 + 0x48);
      text1 = *(XMLCh **)(lVar9 + 0x30);
      pSVar11 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                          (baseTypeInfo->fAttDefs,text1,*(int *)(lVar9 + 0x20));
      if (pSVar11 == (SchemaAttDef *)0x0) {
        iVar7 = 0x71;
        if ((wildCard == (SchemaAttDef *)0x0) ||
           (bVar6 = wildcardAllowsNamespace(this,wildCard,*(uint *)(lVar9 + 0x20)), !bVar6))
        goto LAB_003331dd;
      }
      else {
        DVar3 = (pSVar11->super_XMLAttDef).fDefaultType;
        uVar4 = *(uint *)(lVar10 + 8);
        if ((DVar3 == DefAttTypes_Max) && (uVar4 != 8)) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x74,text1,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else {
          if (((DVar3 & Required) != DefAttTypes_Min) && ((uVar4 & 2) == 0)) {
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6e,text1,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          if (uVar4 == 8) goto LAB_00333205;
        }
        pDVar5 = pSVar11->fDatatypeValidator;
        if ((pDVar5 == (DatatypeValidator *)0x0) ||
           (iVar7 = (*(pDVar5->super_XSerializable)._vptr_XSerializable[9])
                              (pDVar5,*(undefined8 *)(lVar10 + 0x50)), (char)iVar7 == '\0')) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6f,text1,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        if ((DVar3 & Fixed) != DefAttTypes_Min) {
          iVar7 = 0x70;
          if ((uVar4 & 1) != 0) {
            pXVar14 = (pSVar11->super_XMLAttDef).fValue;
            pXVar13 = *(XMLCh **)(lVar10 + 0x20);
            if (pXVar14 == pXVar13) goto LAB_00333205;
            if ((pXVar14 != (XMLCh *)0x0) && (pXVar13 != (XMLCh *)0x0)) {
              do {
                XVar1 = *pXVar14;
                if (XVar1 == L'\0') goto LAB_00333270;
                pXVar14 = pXVar14 + 1;
                XVar2 = *pXVar13;
                pXVar13 = pXVar13 + 1;
              } while (XVar1 == XVar2);
              goto LAB_003331dd;
            }
            if (pXVar14 == (XMLCh *)0x0) {
              if (pXVar13 == (XMLCh *)0x0) goto LAB_00333205;
LAB_00333270:
              XVar1 = *pXVar13;
            }
            else {
              XVar1 = *pXVar14;
              if ((pXVar13 != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_00333270;
            }
            if (XVar1 == L'\0') goto LAB_00333205;
          }
LAB_003331dd:
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar7,text1,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
LAB_00333205:
      uVar15 = uVar15 + 1;
      this_00 = pTVar8;
      uVar12 = (**(code **)(*(long *)pTVar8 + 0x50))();
    } while (uVar15 < uVar12);
  }
  pSVar11 = childTypeInfo->fAttWildCard;
  if (pSVar11 == (SchemaAttDef *)0x0) {
    return;
  }
  if (wildCard == (SchemaAttDef *)0x0) {
    iVar7 = 0x72;
  }
  else {
    bVar6 = isWildCardSubset(this_00,wildCard,pSVar11);
    iVar7 = 0x73;
    if ((bVar6) &&
       (iVar7 = 0x75,
       (wildCard->super_XMLAttDef).fDefaultType <= (pSVar11->super_XMLAttDef).fDefaultType)) {
      return;
    }
  }
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar7);
  return;
}

Assistant:

void TraverseSchema::checkAttDerivationOK(const DOMElement* const elem,
                                          const ComplexTypeInfo* const baseTypeInfo,
                                          const ComplexTypeInfo* const childTypeInfo) {

    SchemaAttDefList& childAttList = (SchemaAttDefList&) childTypeInfo->getAttDefList();
    const SchemaAttDef* baseAttWildCard = baseTypeInfo->getAttWildCard();

    for (XMLSize_t i=0; i<childAttList.getAttDefCount(); i++) {

        SchemaAttDef& childAttDef = (SchemaAttDef&) childAttList.getAttDef(i);
        QName* childAttName = childAttDef.getAttName();
        const XMLCh* childLocalPart = childAttName->getLocalPart();
        const SchemaAttDef* baseAttDef = baseTypeInfo->getAttDef(childLocalPart, childAttName->getURI());

        if (baseAttDef) {

            XMLAttDef::DefAttTypes baseAttDefType = baseAttDef->getDefaultType();
            XMLAttDef::DefAttTypes childAttDefType = childAttDef.getDefaultType();

            // Constraint 2.1.1 & 3 + check for prohibited base attribute
            if (baseAttDefType == XMLAttDef::Prohibited
                && childAttDefType != XMLAttDef::Prohibited) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_8, childLocalPart);
            }

            if ((baseAttDefType & XMLAttDef::Required)
                && !(childAttDefType & XMLAttDef::Required)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_2, childLocalPart);
            }

            // if the attribute in the derived type is prohibited, and it didn't try to override a required attribute,
            // it's ok and shouldn't be tested for data type or fixed value
            if (childAttDefType == XMLAttDef::Prohibited)
                continue;

            // Constraint 2.1.2
            DatatypeValidator* baseDV = baseAttDef->getDatatypeValidator();
            DatatypeValidator* childDV = childAttDef.getDatatypeValidator();
            if (!baseDV || !baseDV->isSubstitutableBy(childDV)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_3, childLocalPart);
            }

            // Constraint 2.1.3
            if ((baseAttDefType & XMLAttDef::Fixed) &&
                (!(childAttDefType & XMLAttDef::Fixed) ||
                 !XMLString::equals(baseAttDef->getValue(), childAttDef.getValue()))) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_4, childLocalPart);
            }
        }
        // Constraint 2.2
        else if (!baseAttWildCard ||
                 !wildcardAllowsNamespace(baseAttWildCard, childAttName->getURI())) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_5, childLocalPart);
        }
    }

    // Constraint 4
    const SchemaAttDef* childAttWildCard = childTypeInfo->getAttWildCard();

    if (childAttWildCard) {

        if (!baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_6);
        }
        else if (!isWildCardSubset(baseAttWildCard, childAttWildCard)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_7);
        }
        else if (childAttWildCard->getDefaultType() < baseAttWildCard->getDefaultType()) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_9);
        }
    }
}